

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O2

void Super_WriteLibraryTreeFile_rec
               (FILE *pFile,Super_Man_t *pMan,Super_Gate_t_conflict *pSuper,int *pCounter)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  
  if ((*(uint *)&pSuper->field_0x8 & 0xffffff01) != 0) {
    return;
  }
  uVar2 = Mio_GateReadPinNum(pSuper->pRoot);
  uVar3 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar3;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    Super_WriteLibraryTreeFile_rec(pFile,pMan,pSuper->pFanins[uVar3],pCounter);
  }
  iVar1 = *pCounter;
  *pCounter = iVar1 + 1;
  uVar2 = *(uint *)&pSuper->field_0x8;
  *(uint *)&pSuper->field_0x8 = iVar1 << 8 | uVar2 & 0xff;
  pcVar4 = "* ";
  if ((uVar2 & 2) == 0) {
    pcVar4 = "";
  }
  fputs(pcVar4,(FILE *)pFile);
  pcVar4 = Mio_GateReadName(pSuper->pRoot);
  fputs(pcVar4,(FILE *)pFile);
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    fprintf((FILE *)pFile," %d",(ulong)(*(uint *)&pSuper->pFanins[uVar3]->field_0x8 >> 8));
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Super_WriteLibraryTreeFile_rec( FILE * pFile, Super_Man_t * pMan, Super_Gate_t * pSuper, int * pCounter )
{
    int nFanins, i;
    // skip an elementary variable and a gate that was already written
    if ( pSuper->fVar || pSuper->Number > 0 )
        return;
    // write the fanins
    nFanins = Mio_GateReadPinNum(pSuper->pRoot);
    for ( i = 0; i < nFanins; i++ )
        Super_WriteLibraryTreeFile_rec( pFile, pMan, pSuper->pFanins[i], pCounter );
    // finally write the gate
    pSuper->Number = (*pCounter)++;
    fprintf( pFile, "%s", pSuper->fSuper? "* " : "" );
    fprintf( pFile, "%s", Mio_GateReadName(pSuper->pRoot) );
    for ( i = 0; i < nFanins; i++ )
        fprintf( pFile, " %d", pSuper->pFanins[i]->Number );
    // write the formula 
    // this step is optional, the resulting library will work in any case
    // however, it may be helpful to for debugging to compare the same library 
    // written in the old format and written in the new format with formulas
//    fprintf( pFile, "    # %s", Super_WriteLibraryGateName( pSuper ) );
    fprintf( pFile, "\n" );
}